

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::SchemaGrammar::SchemaGrammar(SchemaGrammar *this,MemoryManager *manager)

{
  MemoryManager *pMVar1;
  XMLSize_t XVar2;
  int iVar3;
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *pRVar4;
  NameIdPool<xercesc_4_0::XMLNotationDecl> *this_00;
  XMLSchemaDescriptionImpl *this_01;
  RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *pRVar5;
  undefined4 extraout_var;
  XMLSize_t XVar6;
  CleanupType_conflict28 cleanup;
  JanitorMemFunCall<xercesc_4_0::SchemaGrammar> local_40;
  
  (this->super_Grammar).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__SchemaGrammar_0041c070;
  this->fTargetNamespace = (XMLCh *)0x0;
  this->fElemDeclPool =
       (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0;
  this->fElemNonDeclPool =
       (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0;
  this->fGroupElemDeclPool =
       (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0;
  this->fNotationDeclPool = (NameIdPool<xercesc_4_0::XMLNotationDecl> *)0x0;
  this->fAttributeDeclRegistry =
       (RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *)0x0;
  this->fComplexTypeRegistry =
       (RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *)0x0;
  this->fGroupInfoRegistry =
       (RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *)0x0;
  this->fAttGroupInfoRegistry =
       (RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *)0x0;
  this->fValidSubstitutionGroups =
       (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
        *)0x0;
  this->fMemoryManager = manager;
  this->fGramDesc = (XMLSchemaDescription *)0x0;
  this->fAnnotations = (RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *)0x0;
  this->fValidated = false;
  DatatypeValidatorFactory::DatatypeValidatorFactory(&this->fDatatypeRegistry,manager);
  this->fScopeCount = 0;
  this->fAnonTypeCount = 0;
  local_40.fToCall = (MFPT)cleanUp;
  local_40._16_8_ = 0;
  local_40.fObject = this;
  pRVar4 = (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x40,this->fMemoryManager);
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::RefHash3KeysIdPool
            (pRVar4,0x6d,true,0x80,this->fMemoryManager);
  this->fElemDeclPool = pRVar4;
  pRVar4 = (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x40,this->fMemoryManager);
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::RefHash3KeysIdPool
            (pRVar4,0x6d,false,0x80,this->fMemoryManager);
  this->fGroupElemDeclPool = pRVar4;
  this_00 = (NameIdPool<xercesc_4_0::XMLNotationDecl> *)
            XMemory::operator_new(0x58,this->fMemoryManager);
  NameIdPool<xercesc_4_0::XMLNotationDecl>::NameIdPool(this_00,0x6d,0x80,this->fMemoryManager);
  this->fNotationDeclPool = this_00;
  this_01 = (XMLSchemaDescriptionImpl *)XMemory::operator_new(0x40,this->fMemoryManager);
  XMLSchemaDescriptionImpl::XMLSchemaDescriptionImpl
            (this_01,L"http://www.w3.org/2000/xmlns/",this->fMemoryManager);
  this->fGramDesc = (XMLSchemaDescription *)this_01;
  pRVar5 = (RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *)
           XMemory::operator_new(0x38,this->fMemoryManager);
  pMVar1 = this->fMemoryManager;
  pRVar5->fMemoryManager = pMVar1;
  pRVar5->fAdoptedElems = true;
  pRVar5->fBucketList = (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> **)0x0;
  pRVar5->fHashModulus = 0x1d;
  pRVar5->fInitialModulus = 0x1d;
  pRVar5->fCount = 0;
  iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0xe8);
  pRVar5->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> **)CONCAT44(extraout_var,iVar3);
  XVar2 = pRVar5->fHashModulus;
  if (XVar2 != 0) {
    XVar6 = 0;
    do {
      pRVar5->fBucketList[XVar6] = (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0;
      XVar6 = XVar6 + 1;
    } while (XVar2 != XVar6);
  }
  this->fAnnotations = pRVar5;
  (*(this->super_Grammar).super_XSerializable._vptr_XSerializable[0x14])(this);
  local_40.fObject = (SchemaGrammar *)0x0;
  JanitorMemFunCall<xercesc_4_0::SchemaGrammar>::~JanitorMemFunCall(&local_40);
  return;
}

Assistant:

SchemaGrammar::SchemaGrammar(MemoryManager* const manager) :
    fTargetNamespace(0)
    , fElemDeclPool(0)
    , fElemNonDeclPool(0)
    , fGroupElemDeclPool(0)
    , fNotationDeclPool(0)
    , fAttributeDeclRegistry(0)
    , fComplexTypeRegistry(0)
    , fGroupInfoRegistry(0)
    , fAttGroupInfoRegistry(0)
    , fValidSubstitutionGroups(0)
    , fMemoryManager(manager)
    , fGramDesc(0)
    , fAnnotations(0)
    , fValidated(false)
    , fDatatypeRegistry(manager)
    , fScopeCount (0)
    , fAnonTypeCount (0)
{
    CleanupType cleanup(this, &SchemaGrammar::cleanUp);

    //
    //  Init all the pool members.
    //
    //  <TBD> Investigate what the optimum values would be for the various
    //  pools.
    //
    fElemDeclPool = new (fMemoryManager) RefHash3KeysIdPool<SchemaElementDecl>(109, true, 128, fMemoryManager);

    try {
        // should not be necessary now that grammars, once built,
        // are read-only
        // fElemNonDeclPool = new (fMemoryManager) RefHash3KeysIdPool<SchemaElementDecl>(29, true, 128, fMemoryManager);
        fGroupElemDeclPool = new (fMemoryManager) RefHash3KeysIdPool<SchemaElementDecl>(109, false, 128, fMemoryManager);
        fNotationDeclPool = new (fMemoryManager) NameIdPool<XMLNotationDecl>(109, 128, fMemoryManager);

        //REVISIT: use grammarPool to create
        fGramDesc = new (fMemoryManager) XMLSchemaDescriptionImpl(XMLUni::fgXMLNSURIName, fMemoryManager);

        // Create annotation table
        fAnnotations = new (fMemoryManager) RefHashTableOf<XSAnnotation, PtrHasher>
        (
            29, true, fMemoryManager
        );

        //
        //  Call our own reset method. This lets us have the pool setup stuff
        //  done in just one place (because this stame setup stuff has to be
        //  done every time we are reset.)
        //
        reset();
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}